

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringMeasure(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  StringMeasure *pSVar2;
  HeapType local_30;
  Expression *local_28;
  Expression *ref;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  ref._4_4_ = 2;
  local_18 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,(BasicType *)((long)&ref + 4));
  if (!bVar1) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xeaa,"Expression *wasm::TranslateToFuzzReader::makeStringMeasure(Type)");
  }
  HeapType::HeapType(&local_30,string);
  local_28 = makeTrappingRefUse(this,local_30);
  pSVar2 = Builder::makeStringMeasure(&this->builder,StringMeasureWTF16,local_28);
  return (Expression *)pSVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringMeasure(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  return builder.makeStringMeasure(StringMeasureWTF16, ref);
}